

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FOOLElimination.cpp
# Opt level: O0

void FOOLElimination::buildApplication
               (uint symbol,Context context,TermStack *vars,TermList *functionApplication,
               Formula **predicateApplication)

{
  undefined4 uVar1;
  void *pvVar2;
  size_t sVar3;
  undefined8 *in_RCX;
  Stack<Kernel::TermList> *in_RDX;
  byte in_SIL;
  undefined4 in_EDI;
  undefined8 *in_R8;
  TermList *in_stack_00000040;
  uint in_stack_00000048;
  uint in_stack_0000004c;
  Term *in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  undefined8 local_38;
  TermList *in_stack_ffffffffffffffd0;
  undefined1 in_stack_ffffffffffffffdf;
  
  if ((in_SIL & 1) == 0) {
    pvVar2 = Kernel::AtomicFormula::operator_new(0xb9704c);
    Lib::Stack<Kernel::TermList>::size(in_RDX);
    Lib::Stack<Kernel::TermList>::begin(in_RDX);
    Kernel::Literal::create
              ((uint)((ulong)in_R8 >> 0x20),(uint)in_R8,(bool)in_stack_ffffffffffffffdf,
               in_stack_ffffffffffffffd0);
    Kernel::AtomicFormula::AtomicFormula
              ((AtomicFormula *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
               (Literal *)in_stack_ffffffffffffff88);
    *in_R8 = pvVar2;
  }
  else {
    sVar3 = Lib::Stack<Kernel::TermList>::size(in_RDX);
    uVar1 = (undefined4)sVar3;
    Lib::Stack<Kernel::TermList>::begin(in_RDX);
    Kernel::Term::create(in_stack_0000004c,in_stack_00000048,in_stack_00000040);
    Kernel::TermList::TermList((TermList *)CONCAT44(uVar1,in_EDI),in_stack_ffffffffffffff88);
    *in_RCX = local_38;
  }
  return;
}

Assistant:

void FOOLElimination::buildApplication(unsigned symbol, Context context, TermStack& vars,
                                       TermList& functionApplication, Formula*& predicateApplication) {
  if (context == FORMULA_CONTEXT) {
    predicateApplication = new AtomicFormula(Literal::create(symbol, vars.size(), true, vars.begin()));
  } else {
    functionApplication = TermList(Term::create(symbol, vars.size(), vars.begin()));
  }
}